

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

void uv__udp_sendmsg(uv_udp_t *handle)

{
  int iVar1;
  long *plVar2;
  undefined8 *puVar3;
  long lVar4;
  int *piVar5;
  msghdr local_68;
  
  do {
    plVar2 = (long *)handle->write_queue[0];
    if (handle->write_queue == (void **)plVar2) {
      return;
    }
    if (plVar2 == (long *)0x0) {
      __assert_fail("q != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/udp.c"
                    ,0xe0,"void uv__udp_sendmsg(uv_udp_t *)");
    }
    local_68.msg_controllen = 0;
    local_68.msg_flags = 0;
    local_68._52_4_ = 0;
    local_68.msg_control = (void *)0x0;
    local_68.msg_name = plVar2 + 2;
    local_68.msg_namelen = 0x10;
    if ((short)plVar2[2] == 10) {
      local_68.msg_namelen = 0x1c;
    }
    local_68._12_4_ = 0;
    local_68.msg_iov = (iovec *)plVar2[0x13];
    local_68.msg_iovlen = (size_t)*(uint *)(plVar2 + 0x12);
    do {
      lVar4 = sendmsg((handle->io_watcher).fd,&local_68,0);
      if (lVar4 != -1) goto LAB_00157201;
      piVar5 = __errno_location();
      iVar1 = *piVar5;
    } while ((long)iVar1 == 4);
    if (iVar1 == 0xb) {
      return;
    }
    lVar4 = -(long)iVar1;
LAB_00157201:
    plVar2[0x14] = lVar4;
    lVar4 = *plVar2;
    *(long *)plVar2[1] = lVar4;
    *(long *)(lVar4 + 8) = plVar2[1];
    *plVar2 = (long)handle->write_completed_queue;
    puVar3 = (undefined8 *)handle->write_completed_queue[1];
    plVar2[1] = (long)puVar3;
    *puVar3 = plVar2;
    handle->write_completed_queue[1] = plVar2;
    uv__io_feed(handle->loop,&handle->io_watcher);
  } while( true );
}

Assistant:

static void uv__udp_sendmsg(uv_udp_t* handle) {
  uv_udp_send_t* req;
  QUEUE* q;
  struct msghdr h;
  ssize_t size;

  while (!QUEUE_EMPTY(&handle->write_queue)) {
    q = QUEUE_HEAD(&handle->write_queue);
    assert(q != NULL);

    req = QUEUE_DATA(q, uv_udp_send_t, queue);
    assert(req != NULL);

    memset(&h, 0, sizeof h);
    if (req->addr.ss_family == AF_UNSPEC) {
      h.msg_name = NULL;
      h.msg_namelen = 0;
    } else {
      h.msg_name = &req->addr;
      if (req->addr.ss_family == AF_INET6)
        h.msg_namelen = sizeof(struct sockaddr_in6);
      else if (req->addr.ss_family == AF_INET)
        h.msg_namelen = sizeof(struct sockaddr_in);
      else if (req->addr.ss_family == AF_UNIX)
        h.msg_namelen = sizeof(struct sockaddr_un);
      else {
        assert(0 && "unsupported address family");
        abort();
      }
    }
    h.msg_iov = (struct iovec*) req->bufs;
    h.msg_iovlen = req->nbufs;

    do {
      size = sendmsg(handle->io_watcher.fd, &h, 0);
    } while (size == -1 && errno == EINTR);

    if (size == -1) {
      if (errno == EAGAIN || errno == EWOULDBLOCK || errno == ENOBUFS)
        break;
    }

    req->status = (size == -1 ? UV__ERR(errno) : size);

    /* Sending a datagram is an atomic operation: either all data
     * is written or nothing is (and EMSGSIZE is raised). That is
     * why we don't handle partial writes. Just pop the request
     * off the write queue and onto the completed queue, done.
     */
    QUEUE_REMOVE(&req->queue);
    QUEUE_INSERT_TAIL(&handle->write_completed_queue, &req->queue);
    uv__io_feed(handle->loop, &handle->io_watcher);
  }
}